

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O2

void __thiscall chrono::ChShaft::VariablesQbIncrementPosition(ChShaft *this,double dt_step)

{
  undefined1 auVar1 [16];
  int iVar2;
  Scalar *pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_28 [24];
  
  iVar2 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar2 != '\0') {
    ChVariables::Get_qb((ChVectorRef *)local_28,&(this->variables).super_ChVariables);
    pSVar3 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()(local_28,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pSVar3;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dt_step;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->pos;
    auVar1 = vfmadd213sd_fma(auVar5,auVar4,auVar1);
    this->pos = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChShaft::VariablesQbIncrementPosition(double dt_step) {
    if (!IsActive())
        return;

    // Updates position with incremental action of speed contained in the
    // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

    double newspeed = variables.Get_qb()(0);

    // ADVANCE POSITION: pos' = pos + dt * vel
    pos = pos + newspeed * dt_step;
}